

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
TwoValuesWithHashCollision_LevelTenCollisionInsert_Test::
~TwoValuesWithHashCollision_LevelTenCollisionInsert_Test
          (TwoValuesWithHashCollision_LevelTenCollisionInsert_Test *this)

{
  (this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.super_Test.
  _vptr_Test = (_func_int **)&PTR__TwoValuesWithHashCollision_0026d7e8;
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~unique_ptr(&(this->super_TwoValuesWithHashCollision).index_);
  (this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.super_Test.
  _vptr_Test = (_func_int **)&PTR__IndexFixture_0026d6b0;
  pstore::database::~database
            (&(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_);
  in_memory_store::~in_memory_store
            (&(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x168);
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LevelTenCollisionInsert) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    index_->insert (t1, std::make_pair ("f"s, "value f"s));
    std::pair<test_trie::iterator, bool> itp =
        index_->insert (t1, std::make_pair ("e"s, "value e"s));
    EXPECT_TRUE (itp.second);
    std::string const & v = (*itp.first).second;
    EXPECT_EQ ("value e", v);

    itp = index_->insert (t1, std::make_pair ("e"s, "new value e"s));
    EXPECT_FALSE (itp.second);
    std::string const & v1 = (*itp.first).second;
    EXPECT_EQ ("value e", v1);
}